

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O2

Vec_Str_t * Wlc_StdinCollectProblem(char *pDir)

{
  int iVar1;
  size_t sVar2;
  Vec_Str_t *p;
  int iVar3;
  
  sVar2 = strlen(pDir);
  p = Vec_StrAlloc(1000);
  iVar3 = (int)sVar2;
  do {
    do {
      iVar1 = fgetc(_stdin);
      if (iVar1 == -1) goto LAB_001ca074;
      Vec_StrPush(p,(char)iVar1);
    } while ((iVar1 != 0x29) || (p->nSize < iVar3));
    iVar1 = strncmp(p->pArray + ((long)p->nSize - (long)iVar3),pDir,(long)iVar3);
  } while (iVar1 != 0);
LAB_001ca074:
  Vec_StrPush(p,'\0');
  return p;
}

Assistant:

Vec_Str_t * Wlc_StdinCollectProblem( char * pDir )
{
    int c, DirSize = strlen(pDir);
    Vec_Str_t * vInput = Vec_StrAlloc( 1000 );
    while ( (c = fgetc(stdin)) != EOF )
    {
        Vec_StrPush( vInput, (char)c );
        if ( c == ')' && Wlc_StdinCollectStop(vInput, pDir, DirSize) )
            break;
    }
    Vec_StrPush( vInput, '\0' );
    return vInput;
}